

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O1

SQRESULT sq_setfreevariable(HSQUIRRELVM v,SQInteger idx,SQUnsignedInteger nval)

{
  long *plVar1;
  SQUnsignedInteger *pSVar2;
  SQObjectType SVar3;
  uint uVar4;
  SQObjectType SVar5;
  ulong uVar6;
  SQWeakRef *pSVar7;
  long *plVar8;
  SQTable *pSVar9;
  SQObjectPtr *pSVar10;
  SQObjectPtr *pSVar11;
  
  if (idx < 0) {
    pSVar10 = SQVM::GetUp(v,idx);
  }
  else {
    pSVar10 = SQVM::GetAt(v,idx + v->_stackbase + -1);
  }
  SVar3 = (pSVar10->super_SQObject)._type;
  if (SVar3 == OT_NATIVECLOSURE) {
    if (((pSVar10->super_SQObject)._unVal.pClosure)->_defaultparams <= nval) {
      sq_throwerror(v,"invalid free var index");
      return -1;
    }
    pSVar11 = SQVM::GetUp(v,-1);
    pSVar10 = ((pSVar10->super_SQObject)._unVal.pClosure)->_outervalues;
    SVar3 = pSVar10[nval].super_SQObject._type;
    pSVar9 = pSVar10[nval].super_SQObject._unVal.pTable;
    pSVar10[nval].super_SQObject._unVal = (pSVar11->super_SQObject)._unVal;
    SVar5 = (pSVar11->super_SQObject)._type;
    pSVar10[nval].super_SQObject._type = SVar5;
    if ((SVar5 >> 0x1b & 1) != 0) {
      pSVar2 = &((pSVar10[nval].super_SQObject._unVal.pTable)->super_SQDelegable).
                super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar2 = *pSVar2 + 1;
    }
    if ((SVar3 >> 0x1b & 1) != 0) {
      pSVar2 = &(pSVar9->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar2 = *pSVar2 - 1;
      if (*pSVar2 == 0) {
        (*(pSVar9->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
  }
  else {
    if (SVar3 != OT_CLOSURE) {
      sq_aux_invalidtype(v,SVar3);
      return -1;
    }
    uVar6 = ((pSVar10->super_SQObject)._unVal.pClosure)->_function->_noutervalues;
    if (nval < uVar6) {
      pSVar11 = SQVM::GetUp(v,-1);
      pSVar7 = (((pSVar10->super_SQObject)._unVal.pClosure)->_outervalues[nval].super_SQObject.
                _unVal.pClosure)->_env;
      uVar4 = *(uint *)&(pSVar7->super_SQRefCounted)._vptr_SQRefCounted;
      plVar8 = (long *)(pSVar7->super_SQRefCounted)._uiRef;
      (pSVar7->super_SQRefCounted)._uiRef = (SQUnsignedInteger)(pSVar11->super_SQObject)._unVal;
      SVar3 = (pSVar11->super_SQObject)._type;
      *(SQObjectType *)&(pSVar7->super_SQRefCounted)._vptr_SQRefCounted = SVar3;
      if ((SVar3 >> 0x1b & 1) != 0) {
        plVar1 = (long *)((pSVar7->super_SQRefCounted)._uiRef + 8);
        *plVar1 = *plVar1 + 1;
      }
      if ((uVar4 >> 0x1b & 1) != 0) {
        plVar1 = plVar8 + 1;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (**(code **)(*plVar8 + 0x10))();
        }
      }
    }
    else {
      sq_throwerror(v,"invalid free var index");
    }
    if (uVar6 <= nval) {
      return -1;
    }
  }
  SQVM::Pop(v);
  return 0;
}

Assistant:

SQRESULT sq_setfreevariable(HSQUIRRELVM v,SQInteger idx,SQUnsignedInteger nval)
{
    SQObjectPtr &self=stack_get(v,idx);
    switch(type(self))
    {
    case OT_CLOSURE:{
        SQFunctionProto *fp = _closure(self)->_function;
        if(((SQUnsignedInteger)fp->_noutervalues) > nval){
            *(_outer(_closure(self)->_outervalues[nval])->_valptr) = stack_get(v,-1);
        }
        else return sq_throwerror(v,_SC("invalid free var index"));
                    }
        break;
    case OT_NATIVECLOSURE:
        if(_nativeclosure(self)->_noutervalues > nval){
            _nativeclosure(self)->_outervalues[nval] = stack_get(v,-1);
        }
        else return sq_throwerror(v,_SC("invalid free var index"));
        break;
    default:
        return sq_aux_invalidtype(v,type(self));
    }
    v->Pop();
    return SQ_OK;
}